

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

double ON_SubDEdgeSharpness::VertexSharpness
                 (ON_SubDVertexTag vertex_tag,double interior_crease_vertex_sharpness,
                 uint sharp_edge_end_count,double maximum_edge_sharpness_at_vertex)

{
  int local_34;
  uint crease_edge_count;
  double maximum_edge_sharpness_at_vertex_local;
  uint sharp_edge_end_count_local;
  double interior_crease_vertex_sharpness_local;
  double dStack_10;
  ON_SubDVertexTag vertex_tag_local;
  
  if (vertex_tag == Corner) {
    return 0.0;
  }
  if (vertex_tag == Smooth) {
    local_34 = 0;
  }
  else if (vertex_tag == Crease) {
    if ((0.0 < interior_crease_vertex_sharpness) && (interior_crease_vertex_sharpness <= 4.0)) {
      if (sharp_edge_end_count == 0) {
        return interior_crease_vertex_sharpness;
      }
      if (maximum_edge_sharpness_at_vertex < interior_crease_vertex_sharpness) {
        return interior_crease_vertex_sharpness;
      }
    }
    local_34 = 2;
  }
  else {
    if (vertex_tag != Dart) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                 ,0x1402,"","vertex_tag parameter is invalid or unset.");
      return 0.0;
    }
    local_34 = 1;
  }
  dStack_10 = maximum_edge_sharpness_at_vertex;
  if (sharp_edge_end_count + local_34 < 2) {
    dStack_10 = 0.0;
  }
  return dStack_10;
}

Assistant:

double ON_SubDEdgeSharpness::VertexSharpness(
  ON_SubDVertexTag vertex_tag,
  double interior_crease_vertex_sharpness,
  unsigned sharp_edge_end_count,
  double maximum_edge_sharpness_at_vertex
)
{
  // NOTE WELL:
  // For edge chains with a constant sharpness, this agrees with DKT SIGGRAPH 1998.
  // For edge chains with variable sharpness, having a sharpness interval on the
  // edge with end values matching at shared vertices gives nicer looking results
  // than assigning a constant sharpness to edges and Chaikin's subdivision rule
  // (averaging) at vertices.

  if (ON_SubDVertexTag::Corner == vertex_tag)
  {
    // No sharpness bias for corner vertex subdivision.
    // At a corner vertex, all subdivision points and the limit point are equal to the level 0 control net point.
    // Thus, applying a sharp bias doesn't modify the subdivision point or limit point.
    return 0.0;
  }

  unsigned crease_edge_count;
  if (ON_SubDVertexTag::Smooth == vertex_tag)
  {
    crease_edge_count = 0;
  }
  else if (ON_SubDVertexTag::Crease == vertex_tag)
  {
    if (interior_crease_vertex_sharpness > 0.0 && interior_crease_vertex_sharpness <= ON_SubDEdgeSharpness::MaximumValue)
    {
      // In the comments below,
      // VSS = vertex sector sharpness = maximum edges sharpness 
      //       at the vertex's end of all smooth edges in the sector.
      if (sharp_edge_end_count <= 0)
      {
        // No edges have nonzero end sharpness at this vertex
        // It should be the case that the origin of this vertex
        // is an interior crease vertex where:
        // 1) One sector (A) had sharp edges and VSS > 0.
        // 2) The other sector (B) had no sharp edges and VSS = 0.
        // 3) This vertex is part of a single sector B copy (or a subdivision of such a copy).
        return interior_crease_vertex_sharpness;
      }

      if (interior_crease_vertex_sharpness > maximum_edge_sharpness_at_vertex)
      {
        // It should be the case that the origin of this vertex
        // is an interior crease vertex where:
        // 1) Both sectors had sharp edges and the VSS of the sectors was different (one could be zero).
        // 2) This vertex is part of a single sector copy of the sector with 
        //    the smaller VSS (or a subdivision of such a copy).
        return interior_crease_vertex_sharpness;
      }
    }

    crease_edge_count = 2;
  }
  else if (ON_SubDVertexTag::Dart == vertex_tag)
  {
    crease_edge_count = 1;
  }
  else
  {
    ON_SUBD_ERROR("vertex_tag parameter is invalid or unset.");
    return 0.0;
  }

  if (sharp_edge_end_count + crease_edge_count < 2U)
  {
    // No sharp bias for the vertex subdivision point.
    return 0.0;
  }

  return maximum_edge_sharpness_at_vertex;
}